

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_36::HttpChunkedEntityWriter::write
          (HttpChunkedEntityWriter *this,int __fd,void *__buf,size_t __n)

{
  ArrayPtr<const_unsigned_char> *pAVar1;
  size_t sVar2;
  HttpOutputStream *pHVar3;
  Array<kj::ArrayPtr<const_unsigned_char>_> *attachments_1;
  size_t size_00;
  undefined4 in_register_00000034;
  ArrayPtr<unsigned_char> AVar4;
  ArrayPtr<const_unsigned_char> AVar5;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces;
  ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> local_138;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> local_128;
  undefined1 local_118 [8];
  Promise<void> promise;
  Array<kj::ArrayPtr<const_unsigned_char>_> parts;
  ArrayPtr<const_unsigned_char> *piece_1;
  ArrayPtr<const_unsigned_char> *__end2_1;
  ArrayPtr<const_unsigned_char> *__begin2_1;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *__range2_1;
  size_t local_c0;
  undefined1 local_a8 [8];
  ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_> partsBuilder;
  undefined1 local_68 [8];
  String header;
  ArrayPtr<const_unsigned_char> *piece;
  ArrayPtr<const_unsigned_char> *__end2;
  ArrayPtr<const_unsigned_char> *__begin2;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *__range2;
  uint64_t size;
  HttpChunkedEntityWriter *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces_local;
  
  __range2 = (ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)0x0;
  this_local = (HttpChunkedEntityWriter *)__buf;
  pieces_local.ptr = (ArrayPtr<const_unsigned_char> *)__n;
  pieces_local.size_ = (size_t)this;
  __end2 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::begin
                     ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
  pAVar1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::end
                     ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
  for (; __end2 != pAVar1; __end2 = __end2 + 1) {
    header.content.disposer = (ArrayDisposer *)__end2;
    sVar2 = ArrayPtr<const_unsigned_char>::size(__end2);
    __range2 = (ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)((long)&__range2->ptr + sVar2);
  }
  if (__range2 == (ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)0x0) {
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  else {
    hex((CappedArray<char,_17UL> *)&partsBuilder.disposer,(unsigned_long)__range2);
    str<kj::CappedArray<char,17ul>,char_const(&)[3]>
              ((String *)local_68,(kj *)&partsBuilder.disposer,(CappedArray<char,_17UL> *)0x93c086,
               (char (*) [3])__n);
    sVar2 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
    heapArrayBuilder<kj::ArrayPtr<unsigned_char_const>>
              ((ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_> *)local_a8,(kj *)(sVar2 + 2),
               size_00);
    AVar4 = String::asBytes((String *)local_68);
    local_c0 = AVar4.size_;
    __range2_1 = (ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)AVar4.ptr;
    ArrayBuilder<kj::ArrayPtr<unsigned_char_const>>::add<kj::ArrayPtr<unsigned_char>>
              ((ArrayBuilder<kj::ArrayPtr<unsigned_char_const>> *)local_a8,
               (ArrayPtr<unsigned_char> *)&__range2_1);
    __end2_1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::begin
                         ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
    pAVar1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::end
                       ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
    for (; __end2_1 != pAVar1; __end2_1 = __end2_1 + 1) {
      ArrayBuilder<kj::ArrayPtr<unsigned_char_const>>::add<kj::ArrayPtr<unsigned_char_const>const&>
                ((ArrayBuilder<kj::ArrayPtr<unsigned_char_const>> *)local_a8,__end2_1);
    }
    AVar5 = operator___kjb<kj::_::ByteLiteral<3UL>__13,_10__>();
    parts.disposer = (ArrayDisposer *)AVar5.ptr;
    ArrayBuilder<kj::ArrayPtr<unsigned_char_const>>::add<kj::ArrayPtr<unsigned_char_const>>
              ((ArrayBuilder<kj::ArrayPtr<unsigned_char_const>> *)local_a8,
               (ArrayPtr<const_unsigned_char> *)&parts.disposer);
    ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_>::finish
              ((Array<kj::ArrayPtr<const_unsigned_char>_> *)&promise,
               (ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_> *)local_a8);
    pHVar3 = HttpEntityBodyWriter::getInner
                       ((HttpEntityBodyWriter *)CONCAT44(in_register_00000034,__fd));
    local_138 = Array<kj::ArrayPtr<const_unsigned_char>_>::asPtr
                          ((Array<kj::ArrayPtr<const_unsigned_char>_> *)&promise);
    local_128 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_138);
    pieces.size_ = (size_t)local_128.ptr;
    pieces.ptr = (ArrayPtr<const_unsigned_char> *)pHVar3;
    HttpOutputStream::writeBodyData((HttpOutputStream *)local_118,pieces);
    attachments_1 = (Array<kj::ArrayPtr<const_unsigned_char>_> *)mv<kj::String>((String *)local_68);
    mv<kj::Array<kj::ArrayPtr<unsigned_char_const>>>
              ((Array<kj::ArrayPtr<const_unsigned_char>_> *)&promise);
    Promise<void>::attach<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>
              ((Promise<void> *)this,(String *)local_118,attachments_1);
    Promise<void>::~Promise((Promise<void> *)local_118);
    Array<kj::ArrayPtr<const_unsigned_char>_>::~Array
              ((Array<kj::ArrayPtr<const_unsigned_char>_> *)&promise);
    ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_>::~ArrayBuilder
              ((ArrayBuilder<kj::ArrayPtr<const_unsigned_char>_> *)local_a8);
    String::~String((String *)local_68);
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    uint64_t size = 0;
    for (auto& piece: pieces) size += piece.size();

    if (size == 0) return kj::READY_NOW;  // can't encode zero-size chunk since it indicates EOF.

    auto header = kj::str(kj::hex(size), "\r\n");
    auto partsBuilder = kj::heapArrayBuilder<ArrayPtr<const byte>>(pieces.size() + 2);
    partsBuilder.add(header.asBytes());
    for (auto& piece: pieces) {
      partsBuilder.add(piece);
    }
    partsBuilder.add("\r\n"_kjb);

    auto parts = partsBuilder.finish();
    auto promise = getInner().writeBodyData(parts.asPtr());
    return promise.attach(kj::mv(header), kj::mv(parts));
  }